

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_resample.c
# Opt level: O2

t_int * upsampling_perform_linear(t_int *w)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  t_int tVar4;
  float *pfVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  
  pfVar2 = (float *)w[2];
  pfVar5 = (float *)w[3];
  tVar4 = w[4];
  iVar6 = (int)w[5] * (int)tVar4;
  pfVar3 = *(float **)(w[1] + 0x30);
  fVar11 = *pfVar2;
  iVar7 = 0;
  pfVar9 = pfVar3;
  if (iVar6 < 1) {
    iVar6 = iVar7;
  }
  do {
    fVar1 = *pfVar9;
    do {
      if (iVar6 == iVar7) {
        *pfVar3 = fVar1;
        return w + 6;
      }
      iVar7 = iVar7 + 1;
      fVar12 = (float)iVar7 / (float)(int)tVar4;
      iVar8 = (int)fVar12;
      uVar10 = -(uint)(fVar12 - (float)(int)fVar12 == 0.0);
      fVar12 = (float)(uVar10 & 0x3f800000 | ~uVar10 & (uint)(fVar12 - (float)(int)fVar12));
      *pfVar5 = (1.0 - fVar12) * fVar1 + fVar11 * fVar12;
      pfVar5 = pfVar5 + 1;
      fVar11 = pfVar2[iVar8];
    } while (iVar8 == 0);
    pfVar9 = pfVar2 + (long)iVar8 + -1;
  } while( true );
}

Assistant:

t_int *upsampling_perform_linear(t_int *w)
{
  t_resample *x= (t_resample *)(w[1]);
  t_sample *in  = (t_sample *)(w[2]); /* original signal     */
  t_sample *out = (t_sample *)(w[3]); /* upsampled signal    */
  int up       = (int)(w[4]);       /* upsampling factor   */
  int parent   = (int)(w[5]);       /* original vectorsize */
  int length   = parent*up;
  int n;
  t_sample *fp;
  t_sample a=*x->buffer, b=*in;


  for (n=0; n<length; n++) {
    t_sample findex = (t_sample)(n+1)/up;
    int     index  = findex;
    t_sample frac=findex - index;
    if (frac==0.)frac=1.;
    *out++ = frac * b + (1.-frac) * a;
    fp = in+index;
    b=*fp;
    a=(index)?*(fp-1):a;
  }

  *x->buffer = a;
  return (w+6);
}